

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2mem.cpp
# Opt level: O0

int dump_param(char *parampath,char *parambinpath,char *idcpppath)

{
  int iVar1;
  undefined8 uVar2;
  reference pvVar3;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  int EOP;
  int v_1;
  float vf_1;
  bool is_float_1;
  char vstr_1 [16];
  int v;
  float vf;
  bool is_float;
  char vstr [16];
  int j;
  int len;
  bool is_array;
  int id;
  char blob_name [257];
  int i_1;
  int bottom_blob_index;
  char bottom_name [257];
  int i;
  int typeindex;
  int top_count;
  int bottom_count;
  char layer_name [257];
  char layer_type [33];
  int nscan;
  int blob_index;
  int layer_index;
  int blob_count;
  int layer_count;
  int magic;
  string include_guard_var;
  string param_var;
  FILE *ip;
  FILE *mp;
  FILE *fp;
  char *in_stack_fffffffffffffab8;
  FILE *pFVar4;
  char *in_stack_fffffffffffffac0;
  undefined7 in_stack_fffffffffffffac8;
  undefined1 in_stack_fffffffffffffacf;
  size_type in_stack_fffffffffffffad8;
  undefined1 *puVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffae0;
  allocator<char> *in_stack_fffffffffffffaf0;
  char *in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffb00;
  int in_stack_fffffffffffffb04;
  char *in_stack_fffffffffffffb08;
  string *this;
  allocator<char> local_499;
  string local_498 [32];
  undefined4 local_478;
  undefined1 local_474 [4];
  undefined1 local_470 [7];
  undefined1 local_469;
  undefined1 local_468 [20];
  allocator<char> local_454 [4];
  char local_450 [7];
  undefined1 local_449;
  undefined1 local_448 [28];
  int local_42c;
  int local_428;
  undefined1 local_421;
  int local_420;
  allocator<char> local_419;
  string local_418 [32];
  undefined1 local_3f8 [264];
  int local_2f0;
  int local_2ec;
  undefined1 local_2e8 [272];
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  undefined1 local_1c8 [272];
  undefined1 local_b8 [36];
  int local_94;
  uint local_90;
  uint local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80 [4];
  string local_70 [32];
  string local_50 [32];
  FILE *local_30;
  FILE *local_28;
  FILE *local_20;
  char *local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = fopen(in_RDI,"rb");
  local_28 = fopen(local_10,"wb");
  local_30 = fopen(local_18,"wb");
  path_to_varname_abi_cxx11_(in_stack_fffffffffffffb08);
  path_to_varname_abi_cxx11_(in_stack_fffffffffffffb08);
  pFVar4 = local_30;
  uVar2 = std::__cxx11::string::c_str();
  fprintf(pFVar4,"#ifndef NCNN_INCLUDE_GUARD_%s\n",uVar2);
  pFVar4 = local_30;
  uVar2 = std::__cxx11::string::c_str();
  fprintf(pFVar4,"#define NCNN_INCLUDE_GUARD_%s\n",uVar2);
  pFVar4 = local_30;
  uVar2 = std::__cxx11::string::c_str();
  fprintf(pFVar4,"namespace %s_id {\n",uVar2);
  local_80[0] = 0;
  __isoc99_fscanf(local_20,"%d",local_80);
  fwrite(local_80,4,1,local_28);
  local_84 = 0;
  local_88 = 0;
  __isoc99_fscanf(local_20,"%d %d",&local_84,&local_88);
  fwrite(&local_84,4,1,local_28);
  fwrite(&local_88,4,1,local_28);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  local_8c = 0;
  local_90 = 0;
  while (iVar1 = feof(local_20), iVar1 == 0) {
    local_94 = 0;
    local_1cc = 0;
    local_1d0 = 0;
    local_94 = __isoc99_fscanf(local_20,"%32s %256s %d %d",local_b8,local_1c8,&local_1cc,&local_1d0)
    ;
    if (local_94 == 4) {
      sanitize_name(in_stack_fffffffffffffac0);
      local_1d4 = ncnn::layer_to_index(in_stack_fffffffffffffab8);
      fwrite(&local_1d4,4,1,local_28);
      fwrite(&local_1cc,4,1,local_28);
      fwrite(&local_1d0,4,1,local_28);
      fprintf(local_30,"const int LAYER_%s = %d;\n",local_1c8,(ulong)local_8c);
      for (local_1d8 = 0; local_1d8 < local_1cc; local_1d8 = local_1d8 + 1) {
        local_94 = __isoc99_fscanf(local_20,"%256s",local_2e8);
        if (local_94 == 1) {
          sanitize_name(in_stack_fffffffffffffac0);
          local_2ec = find_blob_index_by_name
                                ((char *)CONCAT17(in_stack_fffffffffffffacf,
                                                  in_stack_fffffffffffffac8));
          fwrite(&local_2ec,4,1,local_28);
        }
      }
      for (local_2f0 = 0; local_2f0 < local_1d0; local_2f0 = local_2f0 + 1) {
        local_94 = __isoc99_fscanf(local_20,"%256s",local_3f8);
        if (local_94 == 1) {
          sanitize_name(in_stack_fffffffffffffac0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                     in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&blob_names_abi_cxx11_,(long)(int)local_90);
          this = local_418;
          std::__cxx11::string::operator=((string *)pvVar3,this);
          std::__cxx11::string::~string(this);
          std::allocator<char>::~allocator(&local_419);
          fprintf(local_30,"const int BLOB_%s = %d;\n",local_3f8,(ulong)local_90);
          fwrite(&local_90,4,1,local_28);
          local_90 = local_90 + 1;
        }
      }
      local_420 = 0;
      while (in_stack_fffffffffffffb04 = __isoc99_fscanf(local_20,"%d=",&local_420),
            in_stack_fffffffffffffb04 == 1) {
        fwrite(&local_420,4,1,local_28);
        local_421 = local_420 < -0x5b03;
        if ((bool)local_421) {
          local_428 = 0;
          __isoc99_fscanf(local_20,"%d",&local_428);
          fwrite(&local_428,4,1,local_28);
          for (local_42c = 0; local_42c < local_428; local_42c = local_42c + 1) {
            __isoc99_fscanf(local_20,",%15[^,\n ]",local_448);
            local_449 = vstr_is_float(in_stack_fffffffffffffab8);
            in_stack_fffffffffffffb00 = CONCAT13(local_449,(int3)in_stack_fffffffffffffb00);
            if ((bool)local_449) {
              in_stack_fffffffffffffaf8 = local_450;
              __isoc99_sscanf(local_448,"%f");
              fwrite(in_stack_fffffffffffffaf8,4,1,local_28);
            }
            else {
              in_stack_fffffffffffffaf0 = local_454;
              __isoc99_sscanf(local_448,"%d");
              fwrite(in_stack_fffffffffffffaf0,4,1,local_28);
            }
          }
        }
        else {
          __isoc99_fscanf(local_20,"%15s",local_468);
          local_469 = vstr_is_float(in_stack_fffffffffffffab8);
          if ((bool)local_469) {
            puVar5 = local_470;
            __isoc99_sscanf(local_468,"%f");
            fwrite(puVar5,4,1,local_28);
          }
          else {
            puVar5 = local_474;
            __isoc99_sscanf(local_468,"%d");
            fwrite(puVar5,4,1,local_28);
          }
        }
      }
      local_478 = 0xffffff17;
      fwrite(&local_478,4,1,local_28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                 in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&layer_names_abi_cxx11_,(long)(int)local_8c);
      std::__cxx11::string::operator=((string *)pvVar3,local_498);
      std::__cxx11::string::~string(local_498);
      std::allocator<char>::~allocator(&local_499);
      local_8c = local_8c + 1;
    }
  }
  pFVar4 = local_30;
  uVar2 = std::__cxx11::string::c_str();
  fprintf(pFVar4,"} // namespace %s_id\n",uVar2);
  pFVar4 = local_30;
  uVar2 = std::__cxx11::string::c_str();
  fprintf(pFVar4,"#endif // NCNN_INCLUDE_GUARD_%s\n",uVar2);
  fclose(local_20);
  fclose(local_28);
  fclose(local_30);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return 0;
}

Assistant:

static int dump_param(const char* parampath, const char* parambinpath, const char* idcpppath)
{
    FILE* fp = fopen(parampath, "rb");

    FILE* mp = fopen(parambinpath, "wb");
    FILE* ip = fopen(idcpppath, "wb");

    std::string param_var = path_to_varname(parampath);

    std::string include_guard_var = path_to_varname(idcpppath);

    fprintf(ip, "#ifndef NCNN_INCLUDE_GUARD_%s\n", include_guard_var.c_str());
    fprintf(ip, "#define NCNN_INCLUDE_GUARD_%s\n", include_guard_var.c_str());
    fprintf(ip, "namespace %s_id {\n", param_var.c_str());

    int magic = 0;
    fscanf(fp, "%d", &magic);
    fwrite(&magic, sizeof(int), 1, mp);

    int layer_count = 0;
    int blob_count = 0;
    fscanf(fp, "%d %d", &layer_count, &blob_count);
    fwrite(&layer_count, sizeof(int), 1, mp);
    fwrite(&blob_count, sizeof(int), 1, mp);

    layer_names.resize(layer_count);
    blob_names.resize(blob_count);

    int layer_index = 0;
    int blob_index = 0;
    while (!feof(fp))
    {
        int nscan = 0;

        char layer_type[33];
        char layer_name[257];
        int bottom_count = 0;
        int top_count = 0;
        nscan = fscanf(fp, "%32s %256s %d %d", layer_type, layer_name, &bottom_count, &top_count);
        if (nscan != 4)
        {
            continue;
        }

        sanitize_name(layer_name);

        int typeindex = ncnn::layer_to_index(layer_type);
        fwrite(&typeindex, sizeof(int), 1, mp);

        fwrite(&bottom_count, sizeof(int), 1, mp);
        fwrite(&top_count, sizeof(int), 1, mp);

        fprintf(ip, "const int LAYER_%s = %d;\n", layer_name, layer_index);

//         layer->bottoms.resize(bottom_count);
        for (int i=0; i<bottom_count; i++)
        {
            char bottom_name[257];
            nscan = fscanf(fp, "%256s", bottom_name);
            if (nscan != 1)
            {
                continue;
            }

            sanitize_name(bottom_name);

            int bottom_blob_index = find_blob_index_by_name(bottom_name);

            fwrite(&bottom_blob_index, sizeof(int), 1, mp);
        }

//         layer->tops.resize(top_count);
        for (int i=0; i<top_count; i++)
        {
            char blob_name[257];
            nscan = fscanf(fp, "%256s", blob_name);
            if (nscan != 1)
            {
                continue;
            }

            sanitize_name(blob_name);

            blob_names[blob_index] = std::string(blob_name);

            fprintf(ip, "const int BLOB_%s = %d;\n", blob_name, blob_index);

            fwrite(&blob_index, sizeof(int), 1, mp);

            blob_index++;
        }

        // dump layer specific params
        // parse each key=value pair
        int id = 0;
        while (fscanf(fp, "%d=", &id) == 1)
        {
            fwrite(&id, sizeof(int), 1, mp);

            bool is_array = id <= -23300;

            if (is_array)
            {
                int len = 0;
                fscanf(fp, "%d", &len);
                fwrite(&len, sizeof(int), 1, mp);

                for (int j = 0; j < len; j++)
                {
                    char vstr[16];
                    fscanf(fp, ",%15[^,\n ]", vstr);

                    bool is_float = vstr_is_float(vstr);

                    if (is_float)
                    {
                        float vf;
                        sscanf(vstr, "%f", &vf);
                        fwrite(&vf, sizeof(float), 1, mp);
                    }
                    else
                    {
                        int v;
                        sscanf(vstr, "%d", &v);
                        fwrite(&v, sizeof(int), 1, mp);
                    }
                }
            }
            else
            {
                char vstr[16];
                fscanf(fp, "%15s", vstr);

                bool is_float = vstr_is_float(vstr);

                if (is_float)
                {
                    float vf;
                    sscanf(vstr, "%f", &vf);
                    fwrite(&vf, sizeof(float), 1, mp);
                }
                else
                {
                    int v;
                    sscanf(vstr, "%d", &v);
                    fwrite(&v, sizeof(int), 1, mp);
                }
            }
        }

        int EOP = -233;
        fwrite(&EOP, sizeof(int), 1, mp);

        layer_names[layer_index] = std::string(layer_name);

        layer_index++;
    }

    fprintf(ip, "} // namespace %s_id\n", param_var.c_str());
    fprintf(ip, "#endif // NCNN_INCLUDE_GUARD_%s\n", include_guard_var.c_str());

    fclose(fp);

    fclose(mp);
    fclose(ip);

    return 0;
}